

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O1

bool __thiscall
wallet::CCrypter::SetKeyFromPassphrase
          (CCrypter *this,SecureString *key_data,
          span<const_unsigned_char,_18446744073709551615UL> salt,uint rounds,uint derivation_method)

{
  long lVar1;
  pointer puVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = salt._M_extent._M_extent_value._M_extent_value == 8;
  if (bVar4 && rounds != 0) {
    if (derivation_method == 0) {
      iVar3 = BytesToKeySHA512AES((CCrypter *)
                                  CONCAT71((int7)((ulong)this >> 8),bVar4 && rounds != 0),salt,
                                  key_data,rounds,
                                  (this->vchKey).
                                  super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (this->vchIV).
                                  super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      bVar4 = iVar3 == 0x20;
    }
    else {
      bVar4 = false;
    }
    if (bVar4 == false) {
      puVar2 = (this->vchKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      memory_cleanse(puVar2,(long)(this->vchKey).
                                  super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
      puVar2 = (this->vchIV).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      memory_cleanse(puVar2,(long)(this->vchIV).
                                  super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    }
    else {
      this->fKeySet = true;
    }
  }
  else {
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CCrypter::SetKeyFromPassphrase(const SecureString& key_data, const std::span<const unsigned char> salt, const unsigned int rounds, const unsigned int derivation_method)
{
    if (rounds < 1 || salt.size() != WALLET_CRYPTO_SALT_SIZE) {
        return false;
    }

    int i = 0;
    if (derivation_method == 0) {
        i = BytesToKeySHA512AES(salt, key_data, rounds, vchKey.data(), vchIV.data());
    }

    if (i != (int)WALLET_CRYPTO_KEY_SIZE)
    {
        memory_cleanse(vchKey.data(), vchKey.size());
        memory_cleanse(vchIV.data(), vchIV.size());
        return false;
    }

    fKeySet = true;
    return true;
}